

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O0

Few<r3d::Plane<1>,_2> *
r3d::faces_from_verts
          (Few<r3d::Plane<1>,_2> *__return_storage_ptr__,Few<r3d::Vector<1>,_2> *vertices)

{
  Vector<1> *pVVar1;
  Plane<1> *pPVar2;
  Real RVar3;
  Vector<1> local_90;
  Vector<1> local_88;
  Vector<1> local_80;
  Vector<1> local_78;
  Vector<1> local_70;
  Vector<1> local_68;
  Vector<1> local_60;
  Vector<1> local_58;
  Vector<1> local_50 [3];
  Vector<1> local_38;
  Vector<1> local_30;
  Vector<1> local_28;
  undefined1 local_19;
  Few<r3d::Vector<1>,_2> *local_18;
  Few<r3d::Vector<1>,_2> *vertices_local;
  Few<r3d::Plane<1>,_2> *faces;
  
  local_19 = 0;
  local_18 = vertices;
  vertices_local = (Few<r3d::Vector<1>,_2> *)__return_storage_ptr__;
  Few<r3d::Plane<1>,_2>::Few(__return_storage_ptr__);
  pVVar1 = Few<r3d::Vector<1>,_2>::operator[](vertices,1);
  Vector<1>::Vector(&local_38,pVVar1);
  pVVar1 = Few<r3d::Vector<1>,_2>::operator[](vertices,0);
  Vector<1>::Vector(local_50,pVVar1);
  operator-((r3d *)&local_30,&local_38,local_50);
  normalize<1>((r3d *)&local_28,&local_30);
  pPVar2 = Few<r3d::Plane<1>,_2>::operator[](__return_storage_ptr__,0);
  Vector<1>::operator=(&pPVar2->n,&local_28);
  Vector<1>::~Vector(&local_28);
  Vector<1>::~Vector(&local_30);
  Vector<1>::~Vector(local_50);
  Vector<1>::~Vector(&local_38);
  pVVar1 = Few<r3d::Vector<1>,_2>::operator[](vertices,0);
  Vector<1>::Vector(&local_68,pVVar1);
  pVVar1 = Few<r3d::Vector<1>,_2>::operator[](vertices,1);
  Vector<1>::Vector(&local_70,pVVar1);
  operator-((r3d *)&local_60,&local_68,&local_70);
  normalize<1>((r3d *)&local_58,&local_60);
  pPVar2 = Few<r3d::Plane<1>,_2>::operator[](__return_storage_ptr__,1);
  Vector<1>::operator=(&pPVar2->n,&local_58);
  Vector<1>::~Vector(&local_58);
  Vector<1>::~Vector(&local_60);
  Vector<1>::~Vector(&local_70);
  Vector<1>::~Vector(&local_68);
  pPVar2 = Few<r3d::Plane<1>,_2>::operator[](__return_storage_ptr__,0);
  Vector<1>::Vector(&local_78,&pPVar2->n);
  pVVar1 = Few<r3d::Vector<1>,_2>::operator[](vertices,0);
  Vector<1>::Vector(&local_80,pVVar1);
  RVar3 = operator*(&local_78,&local_80);
  pPVar2 = Few<r3d::Plane<1>,_2>::operator[](__return_storage_ptr__,0);
  pPVar2->d = -RVar3;
  Vector<1>::~Vector(&local_80);
  Vector<1>::~Vector(&local_78);
  pPVar2 = Few<r3d::Plane<1>,_2>::operator[](__return_storage_ptr__,1);
  Vector<1>::Vector(&local_88,&pPVar2->n);
  pVVar1 = Few<r3d::Vector<1>,_2>::operator[](vertices,1);
  Vector<1>::Vector(&local_90,pVVar1);
  RVar3 = operator*(&local_88,&local_90);
  pPVar2 = Few<r3d::Plane<1>,_2>::operator[](__return_storage_ptr__,1);
  pPVar2->d = -RVar3;
  Vector<1>::~Vector(&local_90);
  Vector<1>::~Vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

R3D_INLINE Few<Plane<1>, 2> faces_from_verts(Few<Vector<1>, 2> vertices) {
  Few<Plane<1>, 2> faces;
  faces[0].n = normalize(vertices[1] - vertices[0]);
  faces[1].n = normalize(vertices[0] - vertices[1]);
  faces[0].d = -(faces[0].n * vertices[0]);
  faces[1].d = -(faces[1].n * vertices[1]);
  return faces;
}